

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

void Curl_unencode_cleanup(connectdata *conn)

{
  Curl_easy *pCVar1;
  contenc_writer *local_28;
  contenc_writer *writer;
  SingleRequest *k;
  Curl_easy *data;
  connectdata *conn_local;
  
  pCVar1 = conn->data;
  local_28 = (pCVar1->req).writer_stack;
  while (local_28 != (contenc_writer *)0x0) {
    (pCVar1->req).writer_stack = local_28->downstream;
    (*local_28->handler->close_writer)(conn,local_28);
    (*Curl_cfree)(local_28);
    local_28 = (pCVar1->req).writer_stack;
  }
  return;
}

Assistant:

void Curl_unencode_cleanup(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  struct SingleRequest *k = &data->req;
  contenc_writer *writer = k->writer_stack;

  while(writer) {
    k->writer_stack = writer->downstream;
    writer->handler->close_writer(conn, writer);
    free(writer);
    writer = k->writer_stack;
  }
}